

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanLogicalDevice.cpp
# Opt level: O0

ImageWrapper * __thiscall
VulkanUtilities::VulkanLogicalDevice::CreateImage
          (ImageWrapper *__return_storage_ptr__,VulkanLogicalDevice *this,VkImageCreateInfo *ImageCI
          ,char *DebugName)

{
  Char *Message;
  undefined1 local_48 [8];
  string msg;
  char *DebugName_local;
  VkImageCreateInfo *ImageCI_local;
  VulkanLogicalDevice *this_local;
  
  msg.field_2._8_8_ = DebugName;
  if (ImageCI->sType != VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO) {
    Diligent::FormatString<char[26],char[53]>
              ((string *)local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"ImageCI.sType == VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO",
               (char (*) [53])DebugName);
    Message = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (Message,"CreateImage",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanLogicalDevice.cpp"
               ,0xcd);
    std::__cxx11::string::~string((string *)local_48);
  }
  CreateVulkanObject<VkImage_T*,(VulkanUtilities::VulkanHandleTypeId)4,VkResult(*)(VkDevice_T*,VkImageCreateInfo_const*,VkAllocationCallbacks_const*,VkImage_T**),VkImageCreateInfo>
            (__return_storage_ptr__,this,
             (_func_VkResult_VkDevice_T_ptr_VkImageCreateInfo_ptr_VkAllocationCallbacks_ptr_VkImage_T_ptr_ptr
              *)vkCreateImage,ImageCI,(char *)msg.field_2._8_8_,"image");
  return __return_storage_ptr__;
}

Assistant:

ImageWrapper VulkanLogicalDevice::CreateImage(const VkImageCreateInfo& ImageCI,
                                              const char*              DebugName) const
{
    VERIFY_EXPR(ImageCI.sType == VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO);
    return CreateVulkanObject<VkImage, VulkanHandleTypeId::Image>(vkCreateImage, ImageCI, DebugName, "image");
}